

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O3

bool __thiscall Lodtalk::VMContext::isClassOrMetaclass(VMContext *this,Oop oop)

{
  ClassTable *this_00;
  ClassDescription *pCVar1;
  uint uVar2;
  size_t index;
  bool bVar3;
  
  index = 0x1c;
  if (((ulong)oop.field_0 & 1) == 0) {
    uVar2 = oop.field_0._0_4_ & 6;
    index = 0x24;
    if (uVar2 != 2) {
      if (uVar2 != 4) {
        if ((uint)((ulong)*(undefined8 *)oop.field_0 >> 0x2a) == 0xc) {
          return true;
        }
        if (uVar2 == 2) goto LAB_00142818;
        if (uVar2 != 4) {
          index = *(ulong *)oop.field_0 >> 0x2a;
          goto LAB_00142818;
        }
      }
      index = 0x20;
    }
  }
LAB_00142818:
  this_00 = MemoryManager::getClassTable(this->memoryManager);
  pCVar1 = ClassTable::getClassFromIndex(this_00,index);
  if (((ulong)pCVar1 & 1) == 0) {
    uVar2 = (uint)pCVar1 & 6;
    bVar3 = false;
    if ((uVar2 != 2) && (bVar3 = false, uVar2 != 4)) {
      bVar3 = SUB84((pCVar1->super_Behavior).super_Object.super_ProtoObject.object_header_,4) >> 10
              == 0xc;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool VMContext::isClassOrMetaclass(Oop oop)
{
	auto classIndex = classIndexOf(oop);
	if(classIndex == SCI_Metaclass)
		return true;

	auto clazz = getClassFromIndex(classIndexOf(oop));
	return classIndexOf(clazz) == SCI_Metaclass;
}